

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.h
# Opt level: O0

void __thiscall
TrodesMsg::addcontents<unsigned_int,std::__cxx11::string>
          (TrodesMsg *this,string *f,uint head,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail)

{
  ulong uVar1;
  string *this_00;
  undefined8 uVar2;
  string *in_RCX;
  ulong in_RSI;
  char in_DIL;
  string e;
  TrodesMsg *in_stack_ffffffffffffff30;
  string *psVar3;
  string local_78 [32];
  string local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  TrodesMsg *in_stack_ffffffffffffffc0;
  allocator local_21 [33];
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar2 = std::__cxx11::string::operator[](in_RSI);
    appendArg(in_stack_ffffffffffffff30,(char)((ulong)uVar2 >> 0x38),(uint32_t)uVar2);
    std::__cxx11::string::operator[](in_RSI);
    std::__cxx11::string::push_back(in_DIL);
    std::__cxx11::string::substr((ulong)local_58,in_RSI);
    std::__cxx11::string::string(local_78,in_RCX);
    addcontents<std::__cxx11::string>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_58);
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  psVar3 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (this_00,"TrodesMsg Error: Mismatched format string and variables",local_21);
  __cxa_throw(psVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void addcontents(std::string f, H head, T... tail){
        try{
            if(f.empty())
                throw std::string("TrodesMsg Error: Mismatched format string and variables");
            appendArg(f[0], head);
            format.push_back(f[0]);
            addcontents(f.substr(1), tail...);
        } catch(std::string e){
            std::cerr << "[TrodesMsg::addcontents Error] " << e << "\n";
        } catch(...){
            std::cout << "[TrodesMsg::addcontents Error] Unknown exception thrown!\n";
        }
    }